

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_ellswift_xdh
              (secp256k1_context *ctx,uchar *output,uchar *ell_a64,uchar *ell_b64,uchar *seckey32,
              int party,secp256k1_ellswift_xdh_hash_function hashfp,void *data)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined4 extraout_EAX;
  int iVar4;
  ulong uVar5;
  uchar *a;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  secp256k1_fe px;
  secp256k1_fe xd;
  uchar sx [32];
  secp256k1_fe t;
  secp256k1_fe u;
  secp256k1_fe xn;
  uint local_180;
  uint local_17c;
  uchar *local_178;
  uchar *local_170;
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  uint64_t local_148;
  undefined8 local_140;
  secp256k1_fe local_138;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  secp256k1_scalar local_e8;
  secp256k1_fe local_c0;
  secp256k1_fe local_90;
  secp256k1_fe local_60;
  
  local_108._8_8_ = local_108._0_8_;
  if (ctx == (secp256k1_context *)0x0) {
    secp256k1_ellswift_xdh_cold_6();
  }
  else if (output != (uchar *)0x0) {
    if (ell_a64 == (uchar *)0x0) {
      secp256k1_ellswift_xdh_cold_4();
      return 0;
    }
    if (ell_b64 == (uchar *)0x0) {
      secp256k1_ellswift_xdh_cold_3();
      return 0;
    }
    if (seckey32 == (uchar *)0x0) {
      secp256k1_ellswift_xdh_cold_2();
      return 0;
    }
    if (hashfp == (secp256k1_ellswift_xdh_hash_function)0x0) {
      secp256k1_ellswift_xdh_cold_1();
      return 0;
    }
    a = ell_a64;
    if (party == 0) {
      a = ell_b64;
    }
    local_178 = ell_b64;
    local_170 = output;
    secp256k1_fe_impl_set_b32_mod(&local_90,a);
    local_90.magnitude = 1;
    local_90.normalized = 0;
    secp256k1_fe_verify(&local_90);
    secp256k1_fe_impl_set_b32_mod(&local_c0,a + 0x20);
    local_c0.magnitude = 1;
    local_c0.normalized = 0;
    secp256k1_fe_verify(&local_c0);
    secp256k1_ellswift_xswiftec_frac_var(&local_60,&local_138,&local_90,&local_c0);
    secp256k1_scalar_set_b32(&local_e8,seckey32,(int *)&local_180);
    auVar6._0_4_ = -(uint)((uint)local_e8.d[0] == 0 && (int)local_e8.d[2] == 0);
    auVar6._4_4_ = -(uint)(local_e8.d[0]._4_4_ == 0 && local_e8.d[2]._4_4_ == 0);
    auVar6._8_4_ = -(uint)((int)local_e8.d[1] == 0 && (int)local_e8.d[3] == 0);
    auVar6._12_4_ = -(uint)(local_e8.d[1]._4_4_ == 0 && local_e8.d[3]._4_4_ == 0);
    iVar4 = movmskps(extraout_EAX,auVar6);
    local_180 = (uint)(iVar4 == 0xf);
    local_168._8_8_ = &local_e8;
    local_168._0_8_ = 0x4d430005;
    local_158 = ZEXT816(0x20);
    local_148 = 0;
    local_140._0_4_ = 0;
    local_140._4_4_ = 0;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_108._8_8_;
    local_108 = auVar3 << 0x40;
    uVar1 = (long)(int)local_180 - 1;
    uVar5 = CONCAT44(local_e8.d[0]._4_4_,(uint)local_e8.d[0]) & uVar1;
    local_e8.d[0]._0_4_ = local_180 | (uint)uVar5;
    local_e8.d[0]._4_4_ = (int)(uVar5 >> 0x20);
    auVar2._4_4_ = local_e8.d[1]._4_4_;
    auVar2._0_4_ = (int)local_e8.d[1];
    auVar2._8_4_ = (int)local_e8.d[2];
    auVar2._12_4_ = local_e8.d[2]._4_4_;
    auVar7._8_4_ = (int)uVar1;
    auVar7._0_8_ = uVar1;
    auVar7._12_4_ = (int)(uVar1 >> 0x20);
    auVar7 = auVar7 & auVar2;
    local_e8.d[1]._0_4_ = auVar7._0_4_;
    local_e8.d[1]._4_4_ = auVar7._4_4_;
    local_e8.d[2]._0_4_ = auVar7._8_4_;
    local_e8.d[2]._4_4_ = auVar7._12_4_;
    uVar1 = CONCAT44(local_e8.d[3]._4_4_,(int)local_e8.d[3]) & uVar1;
    local_e8.d[3]._0_4_ = (int)uVar1;
    local_e8.d[3]._4_4_ = (int)(uVar1 >> 0x20);
    local_17c = local_180;
    secp256k1_ecmult_const_xonly((secp256k1_fe *)local_168,&local_60,&local_138,&local_e8,1);
    secp256k1_fe_normalize((secp256k1_fe *)local_168);
    secp256k1_fe_get_b32(local_108,(secp256k1_fe *)local_168);
    iVar4 = (*hashfp)(local_170,local_108,ell_a64,local_178,data);
    local_108 = (undefined1  [16])0x0;
    local_f8 = (undefined1  [16])0x0;
    local_140._0_4_ = 0;
    local_140._4_4_ = 1;
    local_168 = (undefined1  [16])0x0;
    local_158 = (undefined1  [16])0x0;
    local_148 = 0;
    secp256k1_fe_verify((secp256k1_fe *)local_168);
    return (uint)(local_180 == 0 && iVar4 != 0);
  }
  secp256k1_ellswift_xdh_cold_5();
  return 0;
}

Assistant:

int secp256k1_ellswift_xdh(const secp256k1_context *ctx, unsigned char *output, const unsigned char *ell_a64, const unsigned char *ell_b64, const unsigned char *seckey32, int party, secp256k1_ellswift_xdh_hash_function hashfp, void *data) {
    int ret = 0;
    int overflow;
    secp256k1_scalar s;
    secp256k1_fe xn, xd, px, u, t;
    unsigned char sx[32];
    const unsigned char* theirs64;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(output != NULL);
    ARG_CHECK(ell_a64 != NULL);
    ARG_CHECK(ell_b64 != NULL);
    ARG_CHECK(seckey32 != NULL);
    ARG_CHECK(hashfp != NULL);

    /* Load remote public key (as fraction). */
    theirs64 = party ? ell_a64 : ell_b64;
    secp256k1_fe_set_b32_mod(&u, theirs64);
    secp256k1_fe_set_b32_mod(&t, theirs64 + 32);
    secp256k1_ellswift_xswiftec_frac_var(&xn, &xd, &u, &t);

    /* Load private key (using one if invalid). */
    secp256k1_scalar_set_b32(&s, seckey32, &overflow);
    overflow = secp256k1_scalar_is_zero(&s);
    secp256k1_scalar_cmov(&s, &secp256k1_scalar_one, overflow);

    /* Compute shared X coordinate. */
    secp256k1_ecmult_const_xonly(&px, &xn, &xd, &s, 1);
    secp256k1_fe_normalize(&px);
    secp256k1_fe_get_b32(sx, &px);

    /* Invoke hasher */
    ret = hashfp(output, sx, ell_a64, ell_b64, data);

    memset(sx, 0, 32);
    secp256k1_fe_clear(&px);
    secp256k1_scalar_clear(&s);

    return !!ret & !overflow;
}